

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O0

void __thiscall ParserTest_UnaryLogical_Test::TestBody(ParserTest_UnaryLogical_Test *this)

{
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> node;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_00000380;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_00000388;
  string *in_stack_00000390;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffdd0;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *this_00;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffdd8;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *__u;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_fffffffffffffde0;
  unique_ptr<Node,_std::default_delete<Node>_> *this_01;
  offset_in_Parser_to_subr *in_stack_fffffffffffffde8;
  offset_in_Parser_to_subr *__f;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_fffffffffffffdf0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *this_02;
  allocator<char> *in_stack_fffffffffffffe00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe08;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  *in_stack_fffffffffffffe18;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *__args_2;
  BinaryOperator *in_stack_fffffffffffffe20;
  allocator<char> *__args_1;
  _Head_base<0UL,_ExpressionNode_*,_false> in_stack_fffffffffffffe28;
  undefined8 local_199;
  undefined4 local_174;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_14c;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> local_148;
  undefined1 local_140 [16];
  _Manager_type local_130;
  offset_in_Parser_to_subr local_128 [4];
  allocator<char> local_101;
  string local_100 [36];
  undefined4 local_dc;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_69;
  string local_68 [52];
  undefined4 local_34;
  undefined4 local_28;
  undefined4 local_24;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_18 [3];
  
  local_24 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffde8);
  local_28 = 0xc;
  local_34 = 3;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffde8);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe28._M_head_impl,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  __args_2 = local_18;
  std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
  unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>,void>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffdd0);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffdd0);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffdd0);
  __args_1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  local_a8._M_string_length = (size_type)Parser::parseUnaryLogical;
  local_a8.field_2._M_allocated_capacity = 0;
  __s = (char *)((long)&local_a8.field_2 + 8);
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  this_03 = &local_a8;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>,void>
            ((unique_ptr<Node,_std::default_delete<Node>_> *)in_stack_fffffffffffffde0,
             (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
             in_stack_fffffffffffffdd8);
  setupTest(in_stack_00000390,in_stack_00000388,in_stack_00000380);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr
            ((unique_ptr<Node,_std::default_delete<Node>_> *)in_stack_fffffffffffffde0);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cf8f0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  local_b4 = 2;
  local_cc = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffde8);
  local_d0 = 0xc;
  local_dc = 3;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffde8);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe28._M_head_impl,(BinaryOperator *)__args_1,__args_2);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            ((UnaryOperator *)__args_2,
             (unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)this_03);
  std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::operator=
            (in_stack_fffffffffffffde0,
             (unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffdd8);
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::~unique_ptr
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffdd0);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffdd0);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffdd0);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffdd0);
  __a = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,__a);
  local_140._8_8_ = Parser::parseUnaryLogical;
  local_130 = (_Manager_type)0x0;
  __f = local_128;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_fffffffffffffdf0,__f);
  this_02 = (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_140;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>,void>
            ((unique_ptr<Node,_std::default_delete<Node>_> *)in_stack_fffffffffffffde0,
             (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
             in_stack_fffffffffffffdd8);
  setupTest(in_stack_00000390,in_stack_00000388,in_stack_00000380);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr
            ((unique_ptr<Node,_std::default_delete<Node>_> *)in_stack_fffffffffffffde0);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cfaa4);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  local_14c = 2;
  local_164 = 1;
  std::make_unique<NumericLiteralNode,int>((int *)__f);
  local_168 = 0xe;
  local_174 = 3;
  std::make_unique<NumericLiteralNode,int>((int *)__f);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe28._M_head_impl,(BinaryOperator *)__args_1,__args_2);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            ((UnaryOperator *)__args_2,
             (unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)this_03);
  __u = &local_148;
  std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::operator=
            (in_stack_fffffffffffffde0,(unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)__u
            );
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::~unique_ptr
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffdd0);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffdd0);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffdd0);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffdd0);
  this_01 = (unique_ptr<Node,_std::default_delete<Node>_> *)&local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,__a);
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (this_02,__f);
  this_00 = (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
            &stack0xfffffffffffffe28;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>,void>(this_01,__u);
  setupTest(in_stack_00000390,in_stack_00000388,in_stack_00000380);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(this_01);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cfc41);
  std::__cxx11::string::~string((string *)((long)&local_199 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(ParserTest, UnaryLogical)
{
  std::unique_ptr<ExpressionNode> node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2),
      BinaryOperator::Greater,
      std::make_unique<NumericLiteralNode>(3));
  setupTest("(2 > 3)", &Parser::parseUnaryLogical, std::move(node));

  node = 
    std::make_unique<UnaryNode>(
      UnaryOperator::LogicalNot,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::Greater,
        std::make_unique<NumericLiteralNode>(3)));
  setupTest("!(2 > 3)", &Parser::parseUnaryLogical, std::move(node));

  node = 
    std::make_unique<UnaryNode>(
      UnaryOperator::LogicalNot,
      std::make_unique<BinaryOpNode>(    
        std::make_unique<NumericLiteralNode>(1),
        BinaryOperator::Less,
        std::make_unique<NumericLiteralNode>(3)));
  setupTest("!1 < 3", &Parser::parseUnaryLogical, std::move(node));
}